

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QFont>_>::Data
          (Data<QHashPrivate::Node<QString,_QFont>_> *this,
          Data<QHashPrivate::Node<QString,_QFont>_> *other,size_t reserved)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  Data *pDVar3;
  ulong uVar4;
  Node<QString,_QFont> *pNVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  R RVar10;
  Bucket BVar11;
  QStringView QVar12;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  sVar8 = 0x80;
  if ((0x40 < reserved) && (sVar8 = 0xffffffffffffffff, reserved < 0x4000000000000000)) {
    lVar6 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    sVar8 = 1L << (0x41 - ((byte)lVar6 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = sVar8;
  RVar10 = allocateSpans(sVar8);
  this->spans = (Span *)RVar10.spans;
  uVar1 = other->numBuckets;
  if (0x7f < uVar1) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      pSVar2 = other->spans;
      lVar9 = 0;
      do {
        uVar4 = (ulong)pSVar2->offsets[lVar9 + lVar6];
        if (uVar4 != 0xff) {
          key = pSVar2[uVar7].entries + uVar4;
          QVar12.m_data = *(char16_t **)((long)(key->storage).data + 8);
          QVar12.m_size = *(qsizetype *)((long)(key->storage).data + 0x10);
          sVar8 = qHash(QVar12,this->seed);
          BVar11 = findBucketWithHash<QString>(this,(QString *)key,sVar8);
          pNVar5 = Span<QHashPrivate::Node<QString,_QFont>_>::insert(BVar11.span,BVar11.index);
          pDVar3 = *(Data **)(key->storage).data;
          (pNVar5->key).d.d = pDVar3;
          (pNVar5->key).d.ptr = *(char16_t **)((long)(key->storage).data + 8);
          (pNVar5->key).d.size = *(qsizetype *)((long)(key->storage).data + 0x10);
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QFont::QFont(&pNVar5->value,(QFont *)((long)(key->storage).data + 0x18));
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (uVar7 != uVar1 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }